

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O1

bool __thiscall OpenCLEnum::Device::printInfo(Device *this)

{
  DeviceInfo device_info;
  DeviceInfo local_128;
  
  ocl::DeviceInfo::DeviceInfo(&local_128);
  ocl::DeviceInfo::init(&local_128,(EVP_PKEY_CTX *)this->id);
  ocl::DeviceInfo::print(&local_128);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_128.extensions._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.platform_version._M_dataplus._M_p != &local_128.platform_version.field_2) {
    operator_delete(local_128.platform_version._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.driver_version._M_dataplus._M_p != &local_128.driver_version.field_2) {
    operator_delete(local_128.driver_version._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.vendor_name._M_dataplus._M_p != &local_128.vendor_name.field_2) {
    operator_delete(local_128.vendor_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.device_name._M_dataplus._M_p != &local_128.device_name.field_2) {
    operator_delete(local_128.device_name._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool OpenCLEnum::Device::printInfo() const
{
	ocl::DeviceInfo device_info;
	device_info.init(id);
	device_info.print();
	return true;
}